

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_unittest.pb.cc
# Opt level: O1

void proto2_unittest::TestRequiredMessageMap::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  Map<int,_proto2_unittest::TestRequired> *dest;
  Nonnull<const_char_*> pcVar2;
  
  if (from_msg == to_msg) {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    dest = google::protobuf::internal::TypeDefinedMapFieldBase<int,_proto2_unittest::TestRequired>::
           MutableMap((TypeDefinedMapFieldBase<int,_proto2_unittest::TestRequired> *)(to_msg + 1));
    google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
              ((MapFieldBase *)(from_msg + 1));
    google::protobuf::internal::MapMergeFrom<int,proto2_unittest::TestRequired>
              (dest,(Map<int,_proto2_unittest::TestRequired> *)(from_msg + 2));
    uVar1 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar1 & 1) == 0) {
      return;
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
    return;
  }
  MergeImpl();
}

Assistant:

void TestRequiredMessageMap::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestRequiredMessageMap*>(&to_msg);
  auto& from = static_cast<const TestRequiredMessageMap&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestRequiredMessageMap)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_impl_.map_field_.MergeFrom(from._impl_.map_field_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}